

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O0

void Cba_NtkPrintDistribStat(Cba_Ntk_t *p,int *pCounts,int *pUserCounts)

{
  uint uVar1;
  int iVar2;
  char *pcVar3;
  Cba_Ntk_t *p_00;
  int local_2c;
  int i;
  Cba_Ntk_t *pNtk;
  int *pUserCounts_local;
  int *pCounts_local;
  Cba_Ntk_t *p_local;
  
  uVar1 = Cba_NtkBoxPrimNum(p);
  printf("Primitives (%d):\n",(ulong)uVar1);
  for (local_2c = 0; local_2c < 0x5a; local_2c = local_2c + 1) {
    if (pCounts[local_2c] != 0) {
      pcVar3 = Cba_NtkTypeName(p,local_2c);
      printf("%-20s = %5d\n",pcVar3,(ulong)(uint)pCounts[local_2c]);
    }
  }
  uVar1 = Cba_NtkBoxUserNum(p);
  printf("User hierarchy (%d):\n",(ulong)uVar1);
  for (local_2c = 1; iVar2 = Cba_ManNtkNum(p->pDesign), local_2c <= iVar2; local_2c = local_2c + 1)
  {
    p_00 = Cba_ManNtk(p->pDesign,local_2c);
    if (pUserCounts[local_2c] != 0) {
      pcVar3 = Cba_NtkName(p_00);
      printf("%-20s = %5d\n",pcVar3,(ulong)(uint)pUserCounts[local_2c]);
    }
  }
  return;
}

Assistant:

void Cba_NtkPrintDistribStat( Cba_Ntk_t * p, int * pCounts, int * pUserCounts )
{
    Cba_Ntk_t * pNtk; int i;
    printf( "Primitives (%d):\n", Cba_NtkBoxPrimNum(p) );
    for ( i = 0; i < CBA_BOX_LAST; i++ )
        if ( pCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkTypeName(p, i), pCounts[i] );
    printf( "User hierarchy (%d):\n", Cba_NtkBoxUserNum(p) );
    Cba_ManForEachNtk( p->pDesign, pNtk, i )
        if ( pUserCounts[i] )
            printf( "%-20s = %5d\n", Cba_NtkName(pNtk), pUserCounts[i] );
}